

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O2

int __thiscall QInputDialog::open(QInputDialog *this,char *__file,int __oflag,...)

{
  long lVar1;
  QObject *pQVar2;
  int __oflag_00;
  long in_FS_OFFSET;
  Connection CStack_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
  pQVar2 = (QObject *)signalForMember(___oflag);
  QObject::connect((QObject *)&CStack_38,(char *)this,pQVar2,__file,(ConnectionType)___oflag);
  QMetaObject::Connection::~Connection(&CStack_38);
  QWeakPointer<QObject>::assign<QObject>((QWeakPointer<QObject> *)(lVar1 + 0x350),(QObject *)__file)
  ;
  QByteArray::operator=((QByteArray *)(lVar1 + 0x360),___oflag);
  QDialog::open(&this->super_QDialog,___oflag,__oflag_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QInputDialog::open(QObject *receiver, const char *member)
{
    Q_D(QInputDialog);
    connect(this, signalForMember(member), receiver, member);
    d->receiverToDisconnectOnClose = receiver;
    d->memberToDisconnectOnClose = member;
    QDialog::open();
}